

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_cross_vec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  float afStack_2c [5];
  int local_18 [6];
  
  fVar1 = c->in[0].m_data[2];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  fVar4 = c->in[1].m_data[1];
  fVar5 = c->in[1].m_data[2];
  fVar6 = c->in[1].m_data[0];
  afStack_2c[2] = fVar2 * fVar6 - fVar3 * fVar5;
  afStack_2c[3] = fVar3 * fVar4 - fVar6 * fVar1;
  afStack_2c[4] = fVar1 * fVar5 - fVar2 * fVar4;
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar7 = 2;
  do {
    (c->color).m_data[local_18[lVar7]] = afStack_2c[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }